

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::changeEvent(QPlainTextEdit *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QPlainTextEditPrivate *this_00;
  QTextDocument *pQVar3;
  QWidget *in_RSI;
  QWidget *in_RDI;
  QWidget *in_stack_00000008;
  QPlainTextEditPrivate *d;
  QPalette *in_stack_ffffffffffffffb8;
  QPlainTextEditControl *pal;
  QWidget *in_stack_ffffffffffffffc0;
  QEvent *in_stack_ffffffffffffffc8;
  QFrame *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  this_00 = d_func((QPlainTextEdit *)0x6c7c01);
  QFrame::changeEvent(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if (TVar2 != ApplicationFontChange) {
    if (TVar2 == PaletteChange) {
      pal = this_00->control;
      QWidget::palette(in_stack_ffffffffffffffc0);
      QWidgetTextControl::setPalette
                ((QWidgetTextControl *)in_stack_ffffffffffffffc0,(QPalette *)pal);
      return;
    }
    if (TVar2 == LayoutDirectionChange) {
      QPlainTextEditPrivate::sendControlEvent
                (this_00,(QEvent *)CONCAT44(0x5a,in_stack_ffffffffffffffe0));
      return;
    }
    if (TVar2 != FontChange) {
      if (TVar2 == EnabledChange) {
        bVar1 = QWidget::isEnabled((QWidget *)0x6c7cd8);
        (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
        QWidget::palette(in_RSI);
        QWidgetTextControl::setPalette((QWidgetTextControl *)in_RSI,in_stack_ffffffffffffffb8);
        QPlainTextEditPrivate::sendControlEvent
                  (this_00,(QEvent *)CONCAT44(TVar2,in_stack_ffffffffffffffe0));
        return;
      }
      if (TVar2 != ActivationChange) {
        return;
      }
      bVar1 = QWidget::isActiveWindow(in_stack_00000008);
      if (bVar1) {
        return;
      }
      QBasicTimer::stop();
      return;
    }
  }
  pQVar3 = QWidgetTextControl::document((QWidgetTextControl *)in_stack_ffffffffffffffc0);
  QWidget::font(in_RDI);
  QTextDocument::setDefaultFont((QFont *)pQVar3);
  return;
}

Assistant:

void QPlainTextEdit::changeEvent(QEvent *e)
{
    Q_D(QPlainTextEdit);
    QAbstractScrollArea::changeEvent(e);

    switch (e->type()) {
    case QEvent::ApplicationFontChange:
    case QEvent::FontChange:
        d->control->document()->setDefaultFont(font());
        break;
    case QEvent::ActivationChange:
        if (!isActiveWindow())
            d->autoScrollTimer.stop();
        break;
    case QEvent::EnabledChange:
        e->setAccepted(isEnabled());
        d->control->setPalette(palette());
        d->sendControlEvent(e);
        break;
    case QEvent::PaletteChange:
        d->control->setPalette(palette());
        break;
    case QEvent::LayoutDirectionChange:
        d->sendControlEvent(e);
        break;
    default:
        break;
    }
}